

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNSubdivPatch1MBlurBuilderSAH<4>::countSubPatches
          (BVHNSubdivPatch1MBlurBuilderSAH<4> *this,size_t *numSubPatches,size_t *numSubPatchesMB,
          ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pstate
          )

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  runtime_error *this_00;
  ulong uVar5;
  ulong uVar6;
  size_t i_1;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  size_t i;
  size_t sVar11;
  PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *this_01;
  undefined1 local_2c2;
  undefined1 local_2c1;
  size_t local_2c0;
  size_t *local_2b8;
  size_t *local_2b0;
  size_t taskCount;
  Iterator<embree::SubdivMesh,_true> iter;
  Iterator<embree::SubdivMesh,_true> *local_290;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_288;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_278;
  Iterator<embree::SubdivMesh,_true> **ppIStack_270;
  undefined1 *local_268;
  undefined1 **ppuStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  long local_228;
  long lStack_220;
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined8 local_204;
  undefined4 local_1fc;
  undefined1 *local_1f8;
  Iterator<embree::SubdivMesh,_true> *local_1f0;
  task_group_context context;
  PrimInfoMB pinfo;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 local_3c;
  
  iter.scene = this->scene;
  context.my_cpu_ctl_env = (uint64_t)&iter;
  iter.all = false;
  sVar10 = ((iter.scene)->geometries).size_active;
  local_2c0 = 0;
  local_2b8 = numSubPatches;
  local_2b0 = numSubPatchesMB;
  for (sVar11 = 0; sVar10 != sVar11; sVar11 = sVar11 + 1) {
    sVar3 = ParallelForForState::init<embree::Scene::Iterator<embree::SubdivMesh,_true>_>::
            anon_class_8_1_4d25ca37::operator()((anon_class_8_1_4d25ca37 *)&context,sVar11);
    local_2c0 = local_2c0 + sVar3;
  }
  (pstate->super_ParallelForForState).N = local_2c0;
  iVar2 = tbb::detail::d1::max_concurrency();
  uVar5 = local_2c0 + 0x3ff >> 10;
  if ((ulong)(long)iVar2 < uVar5) {
    uVar5 = (long)iVar2;
  }
  uVar4 = 0x40;
  if (uVar5 < 0x40) {
    uVar4 = uVar5;
  }
  sVar11 = 0;
  sVar10 = uVar4 + (uVar4 == 0);
  (pstate->super_ParallelForForState).taskCount = sVar10;
  (pstate->super_ParallelForForState).i0[0] = 0;
  (pstate->super_ParallelForForState).j0[0] = 0;
  uVar4 = local_2c0 / sVar10;
  uVar5 = 1;
  uVar9 = 0;
  while (uVar5 < sVar10) {
    sVar3 = ParallelForForState::init<embree::Scene::Iterator<embree::SubdivMesh,_true>_>::
            anon_class_8_1_4d25ca37::operator()((anon_class_8_1_4d25ca37 *)&context,sVar11);
    sVar10 = (pstate->super_ParallelForForState).taskCount;
    uVar7 = (uVar5 + 1) * local_2c0;
    uVar8 = 0;
    uVar6 = uVar9;
    for (; ((uVar9 = (uVar6 + sVar3) - uVar8, uVar8 < sVar3 && (uVar4 <= uVar9)) && (uVar5 < sVar10)
           ); uVar5 = uVar5 + 1) {
      (pstate->super_ParallelForForState).i0[uVar5] = sVar11;
      uVar8 = uVar8 + (uVar4 - uVar6);
      (pstate->super_ParallelForForState).j0[uVar5] = uVar8;
      sVar10 = (pstate->super_ParallelForForState).taskCount;
      uVar9 = uVar7 / sVar10;
      uVar7 = uVar7 + local_2c0;
      uVar6 = uVar4;
      uVar4 = uVar9;
    }
    sVar11 = sVar11 + 1;
  }
  local_278 = &local_c8;
  local_c8._0_8_ = 0x7f8000007f800000;
  local_c8._8_8_ = 0x7f8000007f800000;
  local_b8 = 0xff800000ff800000;
  uStack_b0 = 0xff800000ff800000;
  local_a8 = 0x7f8000007f800000;
  uStack_a0 = 0x7f8000007f800000;
  local_98 = 0xff800000ff800000;
  uStack_90 = 0xff800000ff800000;
  local_88 = 0x7f8000007f800000;
  uStack_80 = 0x7f8000007f800000;
  local_78 = 0xff800000ff800000;
  uStack_70 = 0xff800000ff800000;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_44 = 0x3f8000003f800000;
  local_3c = 0;
  ppIStack_270 = &local_290;
  local_290 = &iter;
  local_1f8 = &local_2c1;
  ppuStack_260 = &local_1f8;
  local_288._8_8_ = &taskCount;
  local_268 = &local_2c2;
  taskCount = sVar10;
  local_288._0_8_ = pstate;
  local_1f0 = local_290;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  pinfo.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       &local_288;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,sVar10,1,(anon_class_8_1_898bcfc2_conflict10 *)&pinfo,&context);
  cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar1 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
              (&pinfo,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_c8.field_1);
    this_01 = (pstate->prefix_state).sums;
    for (uVar5 = 0; uVar5 < taskCount; uVar5 = uVar5 + 1) {
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context,this_01 + -0x40);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=(this_01,&pinfo);
      local_288._0_8_ =
           (ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)
           0x7f8000007f800000;
      local_288._8_8_ = (size_t *)0x7f8000007f800000;
      local_278 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0xff800000ff800000;
      ppIStack_270 = (Iterator<embree::SubdivMesh,_true> **)0xff800000ff800000;
      local_268 = (undefined1 *)0x7f8000007f800000;
      ppuStack_260 = (undefined1 **)0x7f8000007f800000;
      local_258 = 0xff800000ff800000;
      uStack_250 = 0xff800000ff800000;
      local_248 = 0x7f8000007f800000;
      uStack_240 = 0x7f8000007f800000;
      local_238 = 0xff800000ff800000;
      uStack_230 = 0xff800000ff800000;
      local_228 = context.padding._24_8_ + pinfo.object_range._begin;
      lStack_220 = context.padding._32_8_ + pinfo.object_range._end;
      local_218 = (undefined1  [16])0x0;
      local_208 = 0;
      local_204 = 0x3f8000003f800000;
      local_1fc = 0;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::operator=
                (&pinfo,(PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_288.field_1);
      this_01 = this_01 + 1;
    }
    *local_2b8 = pinfo.object_range._begin;
    *local_2b0 = pinfo.object_range._end;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void countSubPatches(size_t& numSubPatches, size_t& numSubPatchesMB, ParallelForForPrefixSumState<PrimInfoMB>& pstate)
      {
        Scene::Iterator<SubdivMesh,true> iter(scene);
        pstate.init(iter,size_t(1024));

        PrimInfoMB pinfo = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB
        { 
          size_t s = 0;
          size_t sMB = 0;
          for (size_t f=r.begin(); f!=r.end(); ++f) 
          {          
            if (!mesh->valid(f)) continue;
            size_t count = patch_eval_subdivision_count(mesh->getHalfEdge(0,f));
            s += count;
            sMB += count * mesh->numTimeSteps;
          }
          return PrimInfoMB(s,sMB);
        }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB(a.begin()+b.begin(),a.end()+b.end()); });

        numSubPatches = pinfo.begin();
        numSubPatchesMB = pinfo.end();
      }